

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_sparse.cpp
# Opt level: O3

Matrix_Sparse * __thiscall Disa::Matrix_Sparse::operator*=(Matrix_Sparse *this,Matrix_Sparse *other)

{
  source_location *psVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  undefined8 i_column;
  bool bVar7;
  Scalar *pSVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  source_location *location;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  size_t sVar12;
  unsigned_long uVar13;
  size_type sVar14;
  const_iterator cVar15;
  iterator __begin1;
  iterator __end1;
  Matrix_Sparse copy;
  undefined1 local_220 [40];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  undefined1 local_190 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  matrix_type *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_110;
  vector<double,_std::allocator<double>_> local_f8;
  size_t sStack_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined **local_38;
  
  psVar1 = (source_location *)
           (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  location = (source_location *)
             (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
  sVar12 = 0;
  if (psVar1 != location) {
    sVar12 = ((long)psVar1 - (long)location >> 3) - 1;
  }
  if (this->column_size == sVar12) {
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    sStack_e0 = 0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128._16_8_ = (pointer)0x0;
    vStack_110.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_128._0_8_ = (pointer)0x0;
    local_128._8_8_ = (pointer)0x0;
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    sVar14 = 1;
    if (puVar3 != puVar2) {
      sVar14 = (long)puVar3 - (long)puVar2 >> 3;
    }
    puVar2 = (other->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar5 = (other->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,sVar14);
    sVar14 = ((long)puVar2 - (long)puVar5 >> 3) + ((long)puVar4 - (long)puVar3 >> 3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&vStack_110,sVar14);
    std::vector<double,_std::allocator<double>_>::reserve(&local_f8,sVar14);
    puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_220._0_8_ = (matrix_type *)0x0;
    if (puVar2 != puVar3) {
      local_220._0_8_ = (matrix_type *)(((long)puVar2 - (long)puVar3 >> 3) + -1);
    }
    local_1d8._0_8_ = other->column_size;
    resize((Matrix_Sparse *)local_128,(size_t *)local_220,(size_t *)local_1d8);
    std::swap<Disa::Matrix_Sparse>(this,(Matrix_Sparse *)local_128);
    Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Row
              ((Iterator_Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_1b0,0,
               (matrix_type *)local_128);
    end((Matrix_Sparse *)local_190);
    if ((local_1b0._M_dataplus._M_p != (pointer)local_190._0_8_) ||
       (local_1b0._M_string_length != local_190._8_8_)) {
      do {
        lVar6 = *(long *)(*(long *)local_1b0._M_dataplus._M_p + local_1b0._M_string_length * 8);
        Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                  ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_1d8,
                   (matrix_type *)local_1b0._M_dataplus._M_p,&local_1b0._M_string_length,
                   (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    (local_1b0._M_dataplus._M_p + 0x18))->
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar6,
                   (((vector<double,_std::allocator<double>_> *)(local_1b0._M_dataplus._M_p + 0x30))
                   ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar6);
        while ((((lVar6 = *(long *)(*(long *)local_1b0._M_dataplus._M_p + 8 +
                                   local_1b0._M_string_length * 8),
                 Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                           ((Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse> *)local_220,
                            (matrix_type *)local_1b0._M_dataplus._M_p,&local_1b0._M_string_length,
                            (((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (local_1b0._M_dataplus._M_p + 0x18))->
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar6,
                            (((vector<double,_std::allocator<double>_> *)
                             (local_1b0._M_dataplus._M_p + 0x30))->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar6),
                 local_1d8._24_8_ != local_220._24_8_ || (local_1d8._16_8_ != local_220._16_8_)) ||
                (local_1d8._0_8_ != local_220._0_8_)) || (local_1d8._8_8_ != local_220._8_8_))) {
          cVar15 = begin(other);
          local_220._0_8_ = cVar15.matrix_row.matrix;
          local_220._8_8_ = cVar15.matrix_row.row_index + *(long *)local_1d8._0_8_;
          uVar13 = (((matrix_type *)local_220._0_8_)->row_non_zero).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[local_220._8_8_];
          Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::Iterator_Matrix_Sparse_Element
                    ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_1f8,
                     (matrix_type *)local_220._0_8_,(size_t *)(local_220 + 8),
                     (((matrix_type *)local_220._0_8_)->column_index).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar13,
                     (((matrix_type *)local_220._0_8_)->element_value).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar13);
          while( true ) {
            cVar15 = begin(other);
            local_170._M_dataplus._M_p = (pointer)cVar15.matrix_row.matrix;
            local_170._M_string_length = cVar15.matrix_row.row_index + *(long *)local_1d8._0_8_;
            uVar13 = (((matrix_type *)local_170._M_dataplus._M_p)->row_non_zero).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[local_170._M_string_length + 1];
            Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse>::
            Iterator_Matrix_Sparse_Element
                      ((Iterator_Matrix_Sparse_Element<const_Disa::Matrix_Sparse> *)local_220,
                       (matrix_type *)local_170._M_dataplus._M_p,&local_170._M_string_length,
                       (((matrix_type *)local_170._M_dataplus._M_p)->column_index).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar13,
                       (((matrix_type *)local_170._M_dataplus._M_p)->element_value).
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar13);
            i_column = local_1f8._0_8_;
            if (((local_1f8._24_8_ == local_220._24_8_) && (local_1f8._16_8_ == local_220._16_8_))
               && ((local_1f8._0_8_ == local_220._0_8_ && (local_1f8._8_8_ == local_220._8_8_))))
            break;
            local_170._M_dataplus._M_p =
                 (pointer)(*(double *)local_1d8._8_8_ * *(double *)local_1f8._8_8_);
            bVar7 = contains(this,(size_t *)(local_1d8 + 0x10),(size_t *)local_1f8._0_8_);
            if (bVar7) {
              local_150 = (matrix_type *)local_170._M_dataplus._M_p;
              operator[]((Matrix_Sparse *)local_220,(size_t *)this);
              pSVar8 = Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                                 ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)local_220,
                                  (size_t *)i_column);
              *pSVar8 = (double)local_150 + *pSVar8;
            }
            else {
              insert((pair<Disa::Iterator_Matrix_Sparse_Element<Disa::Matrix_Sparse>,_bool> *)
                     local_220,this,(size_t *)(local_1d8 + 0x10),(size_t *)i_column,
                     (double *)&local_170);
            }
            local_1f8._0_8_ = local_1f8._0_8_ + 8;
            local_1f8._8_8_ = local_1f8._8_8_ + 8;
          }
          local_1d8._0_8_ = local_1d8._0_8_ + 8;
          local_1d8._8_8_ = local_1d8._8_8_ + 8;
        }
        local_1b0._M_string_length = local_1b0._M_string_length + 1;
      } while ((local_1b0._M_dataplus._M_p != (pointer)local_190._0_8_) ||
              (local_1b0._M_string_length != local_190._8_8_));
    }
    if ((this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
      _S_do_it(&this->row_non_zero);
    }
    if ((this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (this->column_index).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>::
      _S_do_it(&this->column_index);
    }
    if ((this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage !=
        (this->element_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                (&this->element_value);
    }
    ~Matrix_Sparse((Matrix_Sparse *)local_128);
    return this;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  local_38 = &PTR_s__workspace_llm4binary_github_lic_0015ed68;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
             (Disa *)0x0,(Log_Level)&local_38,location);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_128._0_8_,local_128._8_8_);
  puVar2 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (this->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar13 = 0;
  if (puVar2 != puVar3) {
    uVar13 = ((long)puVar2 - (long)puVar3 >> 3) - 1;
  }
  std::__cxx11::to_string(&local_78,uVar13);
  std::operator+(&local_58,"Incompatible other dimensions, ",&local_78);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_58,",");
  local_148._M_dataplus._M_p = (pbVar10->_M_dataplus)._M_p;
  paVar11 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p == paVar11) {
    local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
    local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
  }
  local_148._M_string_length = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_98,this->column_size);
  std::operator+(&local_170,&local_148,&local_98);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_170," vs. ");
  local_190._0_8_ = (pbVar10->_M_dataplus)._M_p;
  paVar11 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._0_8_ == paVar11) {
    local_190._16_8_ = paVar11->_M_allocated_capacity;
    local_190._24_8_ = *(undefined8 *)((long)&pbVar10->field_2 + 8);
    local_190._0_8_ = local_190 + 0x10;
  }
  else {
    local_190._16_8_ = paVar11->_M_allocated_capacity;
  }
  local_190._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  puVar2 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar3 = (other->row_non_zero).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar13 = ((long)puVar2 - (long)puVar3 >> 3) - 1;
  if (puVar2 == puVar3) {
    uVar13 = 0;
  }
  std::__cxx11::to_string(&local_b8,uVar13);
  std::operator+(&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
                 &local_b8);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_1b0,",");
  local_1f8._0_8_ = (pbVar10->_M_dataplus)._M_p;
  paVar11 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._0_8_ == paVar11) {
    local_1f8._16_8_ = paVar11->_M_allocated_capacity;
    local_1f8._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
    local_1f8._0_8_ = local_1f8 + 0x10;
  }
  else {
    local_1f8._16_8_ = paVar11->_M_allocated_capacity;
  }
  local_1f8._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::to_string(&local_d8,other->column_size);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
                 &local_d8);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8,".");
  local_220._0_8_ = (pbVar10->_M_dataplus)._M_p;
  paVar11 = &pbVar10->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._0_8_ == paVar11) {
    local_220._16_8_ = paVar11->_M_allocated_capacity;
    local_220._24_8_ = *(long *)((long)&pbVar10->field_2 + 8);
    local_220._0_8_ = local_220 + 0x10;
  }
  else {
    local_220._16_8_ = paVar11->_M_allocated_capacity;
  }
  local_220._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(char *)local_220._0_8_,local_220._8_8_);
  std::endl<char,std::char_traits<char>>(poVar9);
  std::__cxx11::string::~string((string *)local_220);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)local_1f8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)local_128);
  exit(1);
}

Assistant:

Matrix_Sparse& Matrix_Sparse::operator*=(const Matrix_Sparse& other) {
  ASSERT_DEBUG(column_size == other.size_row(),
               "Incompatible other dimensions, " + std::to_string(size_row()) + "," + std::to_string(size_column()) +
               " vs. " + std::to_string(other.size_row()) + "," + std::to_string(other.size_column()) + ".");
  Matrix_Sparse copy;
  copy.reserve(size_row(), size_non_zero() + other.size_non_zero());
  copy.resize(size_row(), other.size_column());
  std::swap(*this, copy);
  FOR_EACH_REF(iter_row, copy) {
    FOR_ITER_REF(iter_element, iter_row) {
      FOR_ITER(iter_element_other, *(other.begin() + iter_element.i_column())) {
        const std::size_t& i_row = iter_element.i_row();
        const std::size_t& i_column = iter_element_other.i_column();
        const Scalar& value = (*iter_element) * (*iter_element_other);
        if(!contains(i_row, i_column)) insert(i_row, i_column, value);
        else (*this)[i_row][i_column] += value;
      }
    }
  }
  shrink_to_fit();
  return *this;
}